

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall SocketPP::TCPServer::disconnectAllStreams(TCPServer *this)

{
  pointer pTVar1;
  pointer pTVar2;
  
  std::mutex::lock(&this->streamMutex_);
  pTVar1 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (this->connectedStreams_).
                super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    (*(this->super_SocketServer).super_Socket._vptr_Socket[1])(this,(ulong)(uint)pTVar2->fd);
  }
  pTVar2 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->connectedStreams_).
      super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    (this->connectedStreams_).
    super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
  return;
}

Assistant:

void TCPServer::disconnectAllStreams() {
    std::lock_guard<std::mutex> lockStream(streamMutex_);

    for (auto stream:connectedStreams_) {
        onDisconnected(stream.fd);
    }
    connectedStreams_.clear();
}